

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O0

void __thiscall QDnsLookupPrivate::nameserverChanged(QDnsLookupPrivate *this)

{
  QDnsLookup *this_00;
  QDnsLookupPrivate *in_RDI;
  
  this_00 = q_func(in_RDI);
  QObjectBindableProperty::operator_cast_to_QHostAddress_
            ((QObjectBindableProperty<QDnsLookupPrivate,_QHostAddress,_&QDnsLookupPrivate::_qt_property_nameserver_offset,_&QDnsLookupPrivate::nameserverChanged>
              *)0x345670);
  QDnsLookup::nameserverChanged(this_00,(QHostAddress *)in_RDI);
  return;
}

Assistant:

void nameserverChanged()
    {
        emit q_func()->nameserverChanged(nameserver);
    }